

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

void __thiscall
ft::list<double,ft::allocator<double>>::unique<bool(*)(double,double)>
          (list<double,ft::allocator<double>> *this,_func_bool_double_double *binary_pred)

{
  bool bVar1;
  listNode<double> *plVar2;
  undefined1 local_50 [32];
  
  if (1 < *(ulong *)(this + 0x10)) {
    plVar2 = *(node **)(*(long *)(*(long *)this + 0x10) + 0x10);
    while (plVar2 != *(node **)(this + 8)) {
      bVar1 = (*binary_pred)(plVar2->data,plVar2->prev->data);
      if (bVar1) {
        local_50._16_8_ = &PTR__listIterator_0010dd80;
        local_50._24_8_ = plVar2;
        list<double,_ft::allocator<double>_>::erase
                  ((list<double,_ft::allocator<double>_> *)local_50,(iterator *)this);
        plVar2 = (listNode<double> *)local_50._8_8_;
      }
      else {
        plVar2 = plVar2->next;
      }
    }
  }
  return;
}

Assistant:

void unique(BinaryPredicate binary_pred) {
		if (this->size() <= 1)
			return ;
		iterator	it = this->begin();
		++it;
		while (it != this->end()) {
			iterator	prev = it;
			--prev;
			if (binary_pred(*it, *prev))
				it = this->erase(it);
			else
				++it;
		}
	}